

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<ArgumentData,_8U>::grow(SmallArray<ArgumentData,_8U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Allocator *pAVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined4 extraout_var;
  ArgumentData *pAVar11;
  long lVar12;
  uint uVar13;
  ArgumentData *pAVar14;
  ulong uVar15;
  
  uVar13 = (this->max >> 1) + this->max;
  uVar4 = newSize + 4;
  if (newSize < uVar13) {
    uVar4 = uVar13;
  }
  pAVar3 = this->allocator;
  if (pAVar3 == (Allocator *)0x0) {
    pAVar11 = (ArgumentData *)(*(code *)NULLC::alloc)(uVar4 * 0x30 + 4);
    if (uVar4 != 0) {
      pAVar14 = pAVar11;
      do {
        pAVar14->source = (SynBase *)0x0;
        pAVar14->isExplicit = false;
        pAVar14->name = (SynIdentifier *)0x0;
        pAVar14->type = (TypeBase *)0x0;
        pAVar14->value = (ExprBase *)0x0;
        pAVar14->valueFunction = (FunctionData *)0x0;
        pAVar14 = pAVar14 + 1;
      } while (pAVar14 != pAVar11 + (int)uVar4);
    }
  }
  else {
    iVar10 = (*pAVar3->_vptr_Allocator[2])(pAVar3,(ulong)(uVar4 * 0x30 + 4));
    pAVar11 = (ArgumentData *)CONCAT44(extraout_var,iVar10);
    if (uVar4 != 0) {
      pAVar14 = pAVar11;
      do {
        pAVar14->source = (SynBase *)0x0;
        pAVar14->isExplicit = false;
        pAVar14->name = (SynIdentifier *)0x0;
        pAVar14->type = (TypeBase *)0x0;
        pAVar14->value = (ExprBase *)0x0;
        pAVar14->valueFunction = (FunctionData *)0x0;
        pAVar14 = pAVar14 + 1;
      } while (pAVar14 != pAVar11 + (int)uVar4);
    }
  }
  if (this->count != 0) {
    lVar12 = 0;
    uVar15 = 0;
    do {
      pAVar14 = this->data;
      puVar1 = (undefined8 *)((long)&pAVar14->source + lVar12);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pAVar14->name + lVar12);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pAVar14->value + lVar12);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pAVar11->value + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      puVar1 = (undefined8 *)((long)&pAVar11->name + lVar12);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      puVar1 = (undefined8 *)((long)&pAVar11->source + lVar12);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0x30;
    } while (uVar15 < this->count);
  }
  pAVar14 = this->data;
  if (pAVar14 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pAVar14 != (ArgumentData *)0x0) {
        (*(code *)NULLC::dealloc)(pAVar14);
      }
    }
    else if (pAVar14 != (ArgumentData *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pAVar11;
  this->max = uVar4;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}